

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O0

void __thiscall
spdlog::details::T_formatter<spdlog::details::null_scoped_padder>::format
          (T_formatter<spdlog::details::null_scoped_padder> *this,log_msg *param_2,tm *tm_time,
          memory_buf_t *dest)

{
  memory_buf_t *in_RCX;
  long in_RDI;
  null_scoped_padder p;
  size_t field_size;
  char *in_stack_ffffffffffffffc8;
  undefined5 in_stack_ffffffffffffffd0;
  undefined1 in_stack_ffffffffffffffd5;
  undefined1 uVar1;
  null_scoped_padder in_stack_ffffffffffffffd7;
  memory_buf_t *dest_00;
  int n;
  
  dest_00 = (memory_buf_t *)0x8;
  null_scoped_padder::null_scoped_padder
            ((null_scoped_padder *)&stack0xffffffffffffffd7,8,(padding_info *)(in_RDI + 8),in_RCX);
  n = (int)((ulong)in_RCX >> 0x20);
  fmt_helper::pad2(n,dest_00);
  uVar1 = 0x3a;
  fmt::v7::detail::buffer<char>::push_back
            ((buffer<char> *)
             CONCAT17(in_stack_ffffffffffffffd7,
                      CONCAT16(0x3a,CONCAT15(in_stack_ffffffffffffffd5,in_stack_ffffffffffffffd0))),
             in_stack_ffffffffffffffc8);
  fmt_helper::pad2(n,dest_00);
  fmt::v7::detail::buffer<char>::push_back
            ((buffer<char> *)
             CONCAT17(in_stack_ffffffffffffffd7,
                      CONCAT16(uVar1,CONCAT15(0x3a,in_stack_ffffffffffffffd0))),
             in_stack_ffffffffffffffc8);
  fmt_helper::pad2(n,dest_00);
  return;
}

Assistant:

void format(const details::log_msg &, const std::tm &tm_time, memory_buf_t &dest) override
    {
        const size_t field_size = 8;
        ScopedPadder p(field_size, padinfo_, dest);

        fmt_helper::pad2(tm_time.tm_hour, dest);
        dest.push_back(':');
        fmt_helper::pad2(tm_time.tm_min, dest);
        dest.push_back(':');
        fmt_helper::pad2(tm_time.tm_sec, dest);
    }